

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_noise_estimate.c
# Opt level: O0

NOISE_LEVEL av1_noise_estimate_extract_level(NOISE_ESTIMATE *ne)

{
  int iVar1;
  int iVar2;
  int noise_level;
  NOISE_ESTIMATE *ne_local;
  
  iVar1 = ne->value;
  iVar2 = ne->thresh * 2;
  if (iVar1 == iVar2 || SBORROW4(iVar1,iVar2) != iVar1 + ne->thresh * -2 < 0) {
    if (ne->thresh < ne->value) {
      noise_level = 2;
    }
    else {
      noise_level = (int)(ne->thresh >> 1 < ne->value);
    }
  }
  else {
    noise_level = 3;
  }
  return noise_level;
}

Assistant:

NOISE_LEVEL av1_noise_estimate_extract_level(NOISE_ESTIMATE *const ne) {
  int noise_level = kLowLow;
  if (ne->value > (ne->thresh << 1)) {
    noise_level = kHigh;
  } else {
    if (ne->value > ne->thresh)
      noise_level = kMedium;
    else if (ne->value > (ne->thresh >> 1))
      noise_level = kLow;
    else
      noise_level = kLowLow;
  }
  return noise_level;
}